

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Ptr_t *
Acb_GenerateSignalNames
          (Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,int nNodes,Vec_Int_t *vTars,
          Vec_Wec_t *vGates)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Str_t *p_00;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  uVar13 = (long)nNodes + (long)vUsed->nSize;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = (int)uVar13;
  iVar7 = 8;
  if (6 < iVar6 - 1U) {
    iVar7 = iVar6;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar8->pArray = ppvVar9;
  pVVar8->nSize = iVar6;
  uVar14 = 0;
  memset(ppvVar9,0,uVar13 * 8);
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pcVar10 = (char *)malloc(1000);
  p_00->pArray = pcVar10;
  iVar7 = vUsed->nSize;
  if (0 < iVar7) {
    uVar16 = 0;
    if (0 < iVar6) {
      uVar16 = uVar13 & 0xffffffff;
    }
    do {
      iVar7 = vUsed->pArray[uVar14];
      if (((long)iVar7 < 0) || (vDivs->nSize <= iVar7)) goto LAB_00373596;
      iVar7 = vDivs->pArray[iVar7];
      if ((long)iVar7 < 1) goto LAB_003735b5;
      iVar1 = (p->vObjName).nSize;
      if (iVar1 < 1) goto LAB_003735d4;
      if (iVar1 <= iVar7) goto LAB_00373596;
      pcVar10 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[iVar7]);
      if (pcVar10 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar10);
        pcVar12 = (char *)malloc(sVar11 + 1);
        strcpy(pcVar12,pcVar10);
      }
      if (uVar16 == uVar14) goto LAB_003735f3;
      ppvVar9[uVar14] = pcVar12;
      uVar14 = uVar14 + 1;
      iVar7 = vUsed->nSize;
    } while ((long)uVar14 < (long)iVar7);
  }
  if (vGates->nSize != iVar7 + nNodes + vTars->nSize) {
    __assert_fail("Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0x72b,
                  "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  if (0 < vTars->nSize) {
    lVar15 = 0;
    do {
      uVar13 = (ulong)(uint)vUsed->nSize + (ulong)(uint)nNodes + lVar15;
      iVar7 = (int)uVar13;
      if ((iVar7 < 0) || (vGates->nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar13 = uVar13 & 0xffffffff;
      iVar7 = vGates->pArray[uVar13].nSize;
      if (iVar7 < 1) {
LAB_00373596:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = vGates->pArray[uVar13].pArray;
      if (*piVar5 != 0xb) {
        __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                      ,0x72f,
                      "Vec_Ptr_t *Acb_GenerateSignalNames(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Wec_t *)"
                     );
      }
      if (iVar7 == 1) goto LAB_00373596;
      uVar2 = vTars->pArray[lVar15];
      if ((int)uVar2 < 1) {
LAB_003735b5:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      iVar7 = (p->vObjName).nSize;
      if (iVar7 < 1) {
LAB_003735d4:
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if (iVar7 <= (int)uVar2) goto LAB_00373596;
      uVar17 = piVar5[1];
      pcVar10 = Abc_NamStr(p->pDesign->pStrs,(p->vObjName).pArray[uVar2]);
      if (pcVar10 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar10);
        pcVar12 = (char *)malloc(sVar11 + 1);
        strcpy(pcVar12,pcVar10);
      }
      if (((int)uVar17 < 0) || (iVar6 <= (int)uVar17)) {
LAB_003735f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      ppvVar9[uVar17] = pcVar12;
      lVar15 = lVar15 + 1;
    } while (lVar15 < vTars->nSize);
  }
  if (0 < nNodes) {
    uVar2 = vUsed->nSize;
    ppvVar9 = ppvVar9 + uVar2;
    uVar13 = 1;
    uVar17 = uVar2;
    do {
      if (((int)uVar2 < 0) || (iVar6 <= (int)uVar17)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (*ppvVar9 == (void *)0x0) {
        Vec_StrPrintF(p_00,"ww%d",uVar13);
        uVar3 = p_00->nSize;
        uVar4 = p_00->nCap;
        if (uVar3 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (p_00->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(0x10);
            }
            else {
              pcVar10 = (char *)realloc(p_00->pArray,0x10);
            }
            sVar11 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar4 * 2;
            if ((int)sVar11 <= (int)uVar4) goto LAB_00373510;
            if (p_00->pArray == (char *)0x0) {
              pcVar10 = (char *)malloc(sVar11);
            }
            else {
              pcVar10 = (char *)realloc(p_00->pArray,sVar11);
            }
          }
          p_00->pArray = pcVar10;
          p_00->nCap = (int)sVar11;
        }
LAB_00373510:
        uVar13 = (ulong)((int)uVar13 + 1);
        pcVar10 = p_00->pArray;
        p_00->nSize = uVar3 + 1;
        pcVar10[(int)uVar3] = '\0';
        p_00->nCap = 0;
        p_00->nSize = 0;
        p_00->pArray = (char *)0x0;
        *ppvVar9 = pcVar10;
      }
      ppvVar9 = ppvVar9 + 1;
      uVar17 = uVar17 + 1;
    } while ((int)uVar17 < vUsed->nSize + nNodes);
  }
  if (p_00->pArray != (char *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (char *)0x0;
  }
  free(p_00);
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, int nNodes, Vec_Int_t * vTars, Vec_Wec_t * vGates )
{
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_IntSize(vUsed) + nNodes );
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, iObj, nWires = 1;
    // create input names
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    // create names for nodes driving outputs
    assert( Vec_WecSize(vGates) == Vec_IntSize(vUsed) + nNodes + Vec_IntSize(vTars) );
    Vec_IntForEachEntry( vTars, iObj, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, Vec_IntSize(vUsed) + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
    }
    for ( i = Vec_IntSize(vUsed); i < Vec_IntSize(vUsed) + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}